

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O1

void __thiscall
quic::QuicUnackedPacketMap::AddSentPacket
          (QuicUnackedPacketMap *this,uint16_t packet_number,QuicTime *sent_time,
          QuickPacket *sent_packet)

{
  QuickPacket *this_00;
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = CONCAT62(in_register_00000032,packet_number) & 0xffffffff;
  if (this->_unack_sequence_numbers[uVar3] != -1) {
    __assert_fail("_unack_sequence_numbers[packet_number] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/congestion_control/quic_unacked_packet_map.cc"
                  ,0x12,
                  "void quic::QuicUnackedPacketMap::AddSentPacket(uint16_t, QuicTime &, QuickPacket *)"
                 );
  }
  uVar1 = sent_packet->_sequence_number;
  this->_unack_sequence_numbers[uVar3] = (uint)uVar1;
  this_00 = (QuickPacket *)(&this->field_0x0 + (ulong)uVar1 * 0x28);
  bVar2 = QuickPacket::IsValid(this_00);
  if (bVar2) {
    if (this_00->_data_len != sent_packet->_data_len) {
      __assert_fail("_unack_packets[sequence_number].data_len() == sent_packet->data_len()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/congestion_control/quic_unacked_packet_map.cc"
                    ,0x22,
                    "void quic::QuicUnackedPacketMap::AddSentPacket(uint16_t, QuicTime &, QuickPacket *)"
                   );
    }
  }
  else {
    QuickPacket::WriteData(this_00,sent_packet);
  }
  this->_bytes_in_flight = this->_bytes_in_flight + (ulong)sent_packet->_data_len;
  this->_packets_in_flight = this->_packets_in_flight + 1;
  this_00->_pkt_sent_time = sent_time->time_;
  return;
}

Assistant:

void QuicUnackedPacketMap::AddSentPacket(uint16_t packet_number,
		QuicTime &sent_time, 
		QuickPacket* sent_packet)
	{
		uint16_t sequence_number = sent_packet->sequence_number();
		assert(_unack_sequence_numbers[packet_number] == -1);
		_unack_sequence_numbers[packet_number] = sequence_number;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("AddSentPacket set _unack_sequence_numbers[%u] = %u\r\n", packet_number, sequence_number);
#endif

		if (!_unack_packets[sequence_number].IsValid()) {
			_unack_packets[sequence_number].WriteData(sent_packet);
		}
		else {
			// �ش���������Ҫ��д�ڴ�
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("cannot write packet, sequence number = %d\r\n",
					sequence_number);
#endif
			assert(_unack_packets[sequence_number].data_len() == sent_packet->data_len());
		}

		_bytes_in_flight += sent_packet->data_len();
		_packets_in_flight++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("Add  packet sequence number = %d _bytes_in_flight = %llu, new sent len = %d, _packets_in_flight = %llu\r\n",
						sequence_number, _bytes_in_flight, sent_packet->data_len(), _packets_in_flight);
#endif

		_unack_packets[sequence_number].SetSentTime(sent_time.ToDebuggingValue());
	}